

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::STLImporter::InternReadFile
          (STLImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  aiNode *this_00;
  aiMaterial *this_01;
  aiMaterial **ppaVar4;
  DeadlyImportError *pDVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  vector<char,_std::allocator<char>_> buffer2;
  aiString s;
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"rb",(allocator<char> *)&local_478);
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,CONCAT44(s.data._0_4_,s.length));
  stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&s);
  if (stream == (IOStream *)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_478,"Failed to open STL file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   &local_478,".");
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&s);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = (*stream->_vptr_IOStream[6])(stream);
  this->fileSize = uVar3;
  buffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  buffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&buffer2,FORBID_EMPTY);
  this->pScene = pScene;
  this->mBuffer =
       buffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->clrColorDefault).r = 0.6;
  (this->clrColorDefault).g = 0.6;
  (this->clrColorDefault).b = 0.6;
  (this->clrColorDefault).a = 0.6;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  uVar3 = this->fileSize;
  if ((uVar3 < 0x54) || (*(int *)(this->mBuffer + 0x50) * 0x32 + 0x54U != uVar3)) {
    bVar1 = anon_unknown.dwarf_ff8244::IsAsciiSTL(this->mBuffer,uVar3);
    if (!bVar1) {
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_478,"Failed to determine STL storage representation for ",pFile);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                     &local_478,".");
      DeadlyImportError::DeadlyImportError(pDVar5,(string *)&s);
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    LoadASCIIFile(this,pScene->mRootNode);
    bVar1 = false;
  }
  else {
    bVar1 = LoadBinaryFile(this);
  }
  this_01 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_01);
  s.length = 0;
  s.data._0_4_ = s.data._0_4_ & 0xffffff00;
  memset(s.data + 1,0x1b,0x3ff);
  aiString::Set(&s,"DefaultMaterial");
  aiMaterial::AddProperty(this_01,&s,"?mat.name",0,0);
  local_478._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_478._M_string_length = 0x3f8000003f800000;
  if (bVar1 != false) {
    local_478._M_dataplus._M_p = *(pointer *)&this->clrColorDefault;
    local_478._M_string_length._0_4_ = (this->clrColorDefault).b;
    local_478._M_string_length._4_4_ = (this->clrColorDefault).a;
  }
  aiMaterial::AddProperty(this_01,(aiColor4D *)&local_478,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty(this_01,(aiColor4D *)&local_478,1,"$clr.specular",0,0);
  local_478._M_dataplus._M_p = (pointer)0x3d4ccccd3d4ccccd;
  local_478._M_string_length = 0x3f8000003d4ccccd;
  aiMaterial::AddProperty(this_01,(aiColor4D *)&local_478,1,"$clr.ambient",0,0);
  pScene->mNumMaterials = 1;
  ppaVar4 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar4;
  *ppaVar4 = this_01;
  this->mBuffer = (char *)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer2.super__Vector_base<char,_std::allocator<char>_>);
  (*stream->_vptr_IOStream[1])(stream);
  return;
}

Assistant:

void STLImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler )
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open STL file " + pFile + ".");
    }

    fileSize = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> buffer2;
    TextFileToBuffer(file.get(),buffer2);

    this->pScene = pScene;
    this->mBuffer = &buffer2[0];

    // the default vertex color is light gray.
    clrColorDefault.r = clrColorDefault.g = clrColorDefault.b = clrColorDefault.a = (ai_real) 0.6;

    // allocate a single node
    pScene->mRootNode = new aiNode();

    bool bMatClr = false;

    if (IsBinarySTL(mBuffer, fileSize)) {
        bMatClr = LoadBinaryFile();
    } else if (IsAsciiSTL(mBuffer, fileSize)) {
        LoadASCIIFile( pScene->mRootNode );
    } else {
        throw DeadlyImportError( "Failed to determine STL storage representation for " + pFile + ".");
    }

    // create a single default material, using a white diffuse color for consistency with
    // other geometric types (e.g., PLY).
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(ai_real(1.0),ai_real(1.0),ai_real(1.0),ai_real(1.0));
    if (bMatClr) {
        clrDiffuse = clrColorDefault;
    }
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);
    clrDiffuse = aiColor4D( ai_real(0.05), ai_real(0.05), ai_real(0.05), ai_real(1.0));
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;

    mBuffer = nullptr;
}